

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,half2 *value)

{
  bool bVar1;
  half hVar2;
  reference pvVar3;
  reference pvVar4;
  float2 local_28;
  float2 v;
  half2 *value_local;
  AsciiParser *this_local;
  
  v._M_elems = (_Type)value;
  bVar1 = ReadBasicType(this,&local_28);
  if (bVar1) {
    pvVar3 = ::std::array<float,_2UL>::operator[](&local_28,0);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    pvVar4 = ::std::array<tinyusdz::value::half,_2UL>::operator[]
                       ((array<tinyusdz::value::half,_2UL> *)v._M_elems,0);
    pvVar4->value = hVar2.value;
    pvVar3 = ::std::array<float,_2UL>::operator[](&local_28,1);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    pvVar4 = ::std::array<tinyusdz::value::half,_2UL>::operator[]
                       ((array<tinyusdz::value::half,_2UL> *)v._M_elems,1);
    pvVar4->value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::half2 *value) {
  // Parse as float
  value::float2 v;
  if (!ReadBasicType(&v)) {
    return false;
  }

  (*value)[0] = value::float_to_half_full(v[0]);
  (*value)[1] = value::float_to_half_full(v[1]);
  return true;
}